

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O2

Compressed_lower_distance_matrix *
read_upper_distance_matrix
          (Compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  istream *piVar1;
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  value_type_conflict local_6c;
  _Vector_base<float,_std::allocator<float>_> local_68;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)1> local_50;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    piVar1 = std::istream::_M_extract<float>((float *)input_stream);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&local_68,&local_6c);
    std::istream::ignore();
  }
  Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)1>::
  Compressed_distance_matrix(&local_50,(vector<float,_std::allocator<float>_> *)&local_68);
  Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>::
  Compressed_distance_matrix<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)1>>
            ((Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0> *)
             __return_storage_ptr__,&local_50);
  Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)1>::
  ~Compressed_distance_matrix(&local_50);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Compressed_lower_distance_matrix read_upper_distance_matrix(std::istream& input_stream) {
  std::vector<value_t> distances;
  value_t value;
  while (input_stream >> value) {
    distances.push_back(value);
    input_stream.ignore();
  }

  return Compressed_lower_distance_matrix(Compressed_upper_distance_matrix(std::move(distances)));
}